

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaPrivate::appendChild(QMdiAreaPrivate *this,QMdiSubWindow *child)

{
  long lVar1;
  bool bVar2;
  QMdiArea *pQVar3;
  QWidget *pQVar4;
  Placer *pPVar5;
  qsizetype qVar6;
  QWidget *in_RSI;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiArea *q;
  QSize newSize;
  WindowFlags in_stack_00000100;
  QWidget *in_stack_fffffffffffffef8;
  WindowType other;
  QObject *pQVar7;
  undefined4 in_stack_ffffffffffffff00;
  WidgetAttribute in_stack_ffffffffffffff04;
  QWidget *in_stack_ffffffffffffff08;
  SubWindowOption SVar8;
  QFlagsStorage<Qt::WindowType> flags;
  QMdiSubWindow *in_stack_ffffffffffffff10;
  QMdiSubWindow *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  QSize *in_stack_ffffffffffffff30;
  QList<QPointer<QMdiSubWindow>_> *child_00;
  QWidget *in_stack_ffffffffffffff48;
  QMdiAreaPrivate *in_stack_ffffffffffffff50;
  QMdiAreaPrivate *this_00;
  QObject local_80 [8];
  QObject local_78 [12];
  QFlagsStorageHelper<Qt::WindowType,_4> local_6c;
  QFlagsStorageHelper<Qt::WindowType,_4> local_68;
  QFlagsStorageHelper<QMdiArea::AreaOption,_4> local_64 [7];
  QIcon in_stack_ffffffffffffffb8;
  QWidget *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar3 = q_func(in_RDI);
  pQVar4 = (QWidget *)QObject::parent((QObject *)0x60f0da);
  if (pQVar4 != (in_RDI->super_QAbstractScrollAreaPrivate).viewport) {
    in_stack_ffffffffffffff50 =
         (QMdiAreaPrivate *)(in_RDI->super_QAbstractScrollAreaPrivate).viewport;
    in_stack_ffffffffffffff48 = in_RSI;
    QWidget::windowFlags((QWidget *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    QWidget::setParent(in_stack_ffffffffffffffc0,(QWidget *)in_stack_ffffffffffffffb8.d,
                       in_stack_00000100);
  }
  child_00 = &in_RDI->childWindows;
  QPointer<QMdiSubWindow>::QPointer<void>
            ((QPointer<QMdiSubWindow> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (QMdiSubWindow *)in_stack_fffffffffffffef8);
  QList<QPointer<QMdiSubWindow>_>::append
            ((QList<QPointer<QMdiSubWindow>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (rvalue_ref)in_stack_fffffffffffffef8);
  QPointer<QMdiSubWindow>::~QPointer((QPointer<QMdiSubWindow> *)0x60f165);
  bVar2 = QWidget::testAttribute(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
  if ((!bVar2) && (bVar2 = QWidget::isVisible((QWidget *)0x60f186), bVar2)) {
    (**(code **)(*(long *)in_RSI + 0x70))();
    QWidget::size(in_stack_fffffffffffffef8);
    QSize::boundedTo((QSize *)in_stack_ffffffffffffff08,
                     (QSize *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    pQVar4 = in_RSI;
    qSmartMinSize(in_stack_fffffffffffffef8);
    QSize::expandedTo((QSize *)in_stack_ffffffffffffff08,
                      (QSize *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    QWidget::resize(pQVar4,in_stack_ffffffffffffff30);
  }
  if (in_RDI->placer == (Placer *)0x0) {
    pPVar5 = (Placer *)operator_new(8);
    QMdi::MinOverlapPlacer::MinOverlapPlacer
              ((MinOverlapPlacer *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    in_RDI->placer = pPVar5;
  }
  place(in_stack_ffffffffffffff50,(Placer *)in_stack_ffffffffffffff48,(QMdiSubWindow *)child_00);
  bVar2 = SUB81((ulong)in_stack_ffffffffffffff08 >> 0x18,0);
  SVar8 = (SubWindowOption)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  if ((in_RDI->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOff) {
    QMdiSubWindow::setOption(in_stack_ffffffffffffff10,SVar8,bVar2);
  }
  else {
    QMdiSubWindow::setOption(in_stack_ffffffffffffff10,SVar8,bVar2);
  }
  bVar2 = SUB81((ulong)in_stack_ffffffffffffff08 >> 0x18,0);
  SVar8 = (SubWindowOption)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  if ((in_RDI->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAlwaysOff) {
    QMdiSubWindow::setOption(in_stack_ffffffffffffff10,SVar8,bVar2);
    flags.i = (Int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  }
  else {
    QMdiSubWindow::setOption(in_stack_ffffffffffffff10,SVar8,bVar2);
    flags.i = (Int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  }
  internalRaise((QMdiAreaPrivate *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                in_stack_ffffffffffffff18);
  QList<QPointer<QMdiSubWindow>_>::size(&in_RDI->childWindows);
  QList<int>::prepend((QList<int> *)0x60f327,
                      (parameter_type)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  if (in_RDI->tabBar != (QMdiAreaTabBar *)0x0) {
    QWidget::windowIcon((QWidget *)in_RDI->tabBar);
    tabTextFor((QMdiSubWindow *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    QTabBar::addTab((QTabBar *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (QIcon *)in_stack_fffffffffffffef8,(QString *)0x60f389);
    QString::~QString((QString *)0x60f396);
    QIcon::~QIcon((QIcon *)&stack0xffffffffffffffb8);
    updateTabBarGeometry(this_00);
    qVar6 = QList<QPointer<QMdiSubWindow>_>::size(&in_RDI->childWindows);
    bVar2 = false;
    if (qVar6 == 1) {
      local_64[0].super_QFlagsStorage<QMdiArea::AreaOption>.i =
           (QFlagsStorage<QMdiArea::AreaOption>)
           QFlags<QMdiArea::AreaOption>::operator&
                     ((QFlags<QMdiArea::AreaOption> *)
                      CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      (AreaOption)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      bVar2 = QFlags<QMdiArea::AreaOption>::operator!((QFlags<QMdiArea::AreaOption> *)local_64);
    }
    if (bVar2 != false) {
      in_RDI->showActiveWindowMaximized = true;
    }
  }
  other = (WindowType)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_6c.super_QFlagsStorage<Qt::WindowType>.i =
       (QFlagsStorage<Qt::WindowType>)
       QWidget::windowFlags
                 ((QWidget *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  local_68.super_QFlagsStorage<Qt::WindowType>.i =
       (QFlagsStorage<Qt::WindowType>)
       QFlags<Qt::WindowType>::operator&
                 ((QFlags<Qt::WindowType> *)
                  CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),other);
  bVar2 = QFlags<Qt::WindowType>::operator!((QFlags<Qt::WindowType> *)&local_68);
  if (bVar2) {
    QFlags<Qt::WindowType>::QFlags
              ((QFlags<Qt::WindowType> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),other);
    QWidget::setWindowFlags
              ((QWidget *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (WindowFlags)flags.i);
  }
  QObject::installEventFilter(&in_RSI->super_QObject);
  pQVar7 = local_78;
  QObject::connect(pQVar7,(char *)in_RSI,(QObject *)"2aboutToActivate()",(char *)pQVar3,0xb1ee90);
  QMetaObject::Connection::~Connection((Connection *)pQVar7);
  pQVar7 = local_80;
  QObject::connect(pQVar7,(char *)in_RSI,
                   (QObject *)"2windowStateChanged(Qt::WindowStates,Qt::WindowStates)",
                   (char *)pQVar3,0xb1eee2);
  QMetaObject::Connection::~Connection((Connection *)pQVar7);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::appendChild(QMdiSubWindow *child)
{
    Q_Q(QMdiArea);
    Q_ASSERT(child && childWindows.indexOf(child) == -1);

    if (child->parent() != viewport)
        child->setParent(viewport, child->windowFlags());
    childWindows.append(QPointer<QMdiSubWindow>(child));

    if (!child->testAttribute(Qt::WA_Resized) && q->isVisible()) {
        QSize newSize(child->sizeHint().boundedTo(viewport->size()));
        child->resize(newSize.expandedTo(qSmartMinSize(child)));
    }

    if (!placer)
        placer = new MinOverlapPlacer;
    place(placer, child);

    if (hbarpolicy != Qt::ScrollBarAlwaysOff)
        child->setOption(QMdiSubWindow::AllowOutsideAreaHorizontally, true);
    else
        child->setOption(QMdiSubWindow::AllowOutsideAreaHorizontally, false);

    if (vbarpolicy != Qt::ScrollBarAlwaysOff)
        child->setOption(QMdiSubWindow::AllowOutsideAreaVertically, true);
    else
        child->setOption(QMdiSubWindow::AllowOutsideAreaVertically, false);

    internalRaise(child);
    indicesToActivatedChildren.prepend(childWindows.size() - 1);
    Q_ASSERT(indicesToActivatedChildren.size() == childWindows.size());

#if QT_CONFIG(tabbar)
    if (tabBar) {
        tabBar->addTab(child->windowIcon(), tabTextFor(child));
        updateTabBarGeometry();
        if (childWindows.size() == 1 && !(options & QMdiArea::DontMaximizeSubWindowOnActivation))
            showActiveWindowMaximized = true;
    }
#endif

    if (!(child->windowFlags() & Qt::SubWindow))
        child->setWindowFlags(Qt::SubWindow);
    child->installEventFilter(q);

    QObject::connect(child, SIGNAL(aboutToActivate()), q, SLOT(_q_deactivateAllWindows()));
    QObject::connect(child, SIGNAL(windowStateChanged(Qt::WindowStates,Qt::WindowStates)),
                     q, SLOT(_q_processWindowStateChanged(Qt::WindowStates,Qt::WindowStates)));
}